

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

ssize_t __thiscall
hwnet::TCPSocket::_recv(TCPSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 in_register_00000034;
  bool *post_local;
  Ptr *buff_local;
  TCPSocket *this_local;
  TCPSocket *pTVar2;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->closed);
  pTVar2 = (TCPSocket *)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    bVar1 = std::operator==(&this->recvCallback_,(nullptr_t)0x0);
    pTVar2 = (TCPSocket *)CONCAT71(extraout_var_00,bVar1);
    if (!bVar1) {
      std::__cxx11::
      list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::
      push_back(&this->recvList,(value_type *)CONCAT44(in_register_00000034,__fd));
      if (this->recvTimeout != 0) {
        registerTimer(this,2);
      }
      pTVar2 = this;
      if (((this->doing & 1U) == 0) && ((this->readable & 1U) != 0)) {
        this->doing = true;
        *(undefined1 *)__buf = 1;
        pTVar2 = (TCPSocket *)__buf;
      }
    }
  }
  return (ssize_t)pTVar2;
}

Assistant:

void TCPSocket::_recv(const Buffer::Ptr &buff,bool &post) {
	if(this->closed) {
		return;
	}

	if(this->recvCallback_ == nullptr) {
		return;
	}
#ifdef GATHER_RECV
	ptrRecvlist->push_back(buff);
#else
	recvList.push_back(buff);
#endif

	if(this->recvTimeout > 0) {
		this->registerTimer(timerRecv);
	}

	if(!this->doing && this->readable) {
		this->doing = true;
		post = true;
	}	
}